

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall
QWidgetPrivate::setGeometry_sys(QWidgetPrivate *this,int x,int y,int w,int h,bool isMove)

{
  undefined1 *puVar1;
  uint uVar2;
  undefined4 uVar3;
  QWidget *this_00;
  QWExtra *pQVar4;
  long lVar5;
  undefined4 uVar9;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var6;
  QRect *pQVar7;
  tuple<QTLWExtra_*,_std::default_delete<QTLWExtra>_> tVar8;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  bool bVar15;
  char cVar16;
  int iVar17;
  int extraout_var;
  QPoint QVar18;
  QPoint QVar19;
  int extraout_EDX;
  int extraout_var_00;
  int iVar20;
  Representation RVar21;
  QWidgetData *pQVar22;
  QWidget *parent;
  Representation RVar23;
  bool bVar24;
  ulong uVar25;
  int iVar26;
  long in_FS_OFFSET;
  QRegion updateRegion;
  QSize local_70;
  QPoint local_68;
  QSize local_60;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  QWidget *pQStack_48;
  undefined1 *puStack_40;
  long local_38;
  
  uVar25 = (ulong)(uint)x;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  pQVar4 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
           super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
           super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
  if (pQVar4 != (QWExtra *)0x0) {
    if (pQVar4->maxw < w) {
      w = pQVar4->maxw;
    }
    if (pQVar4->maxh < h) {
      h = pQVar4->maxh;
    }
    if (w <= pQVar4->minw) {
      w = pQVar4->minw;
    }
    if (h <= pQVar4->minh) {
      h = pQVar4->minh;
    }
  }
  if ((((((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) &&
       (lVar5 = *(long *)(*(long *)&this_00->field_0x8 + 0x78), lVar5 != 0)) &&
      (lVar5 = *(long *)(lVar5 + 8), lVar5 != 0)) &&
     ((*(long *)(lVar5 + 0x20) != 0 &&
      (cVar16 = (**(code **)(*QGuiApplicationPrivate::platform_integration + 0x10))
                          (QGuiApplicationPrivate::platform_integration,10), cVar16 == '\0')))) {
    iVar17 = QWindow::geometry();
    w = (extraout_EDX - iVar17) + 1;
    QWindow::geometry();
    h = (extraout_var_00 - extraout_var) + 1;
    y = 0;
    uVar25 = 0;
  }
  pQVar22 = this_00->data;
  uVar3 = (pQVar22->crect).x1;
  uVar9 = (pQVar22->crect).y1;
  RVar23.m_i = ((pQVar22->crect).x2.m_i - uVar3) + 1;
  RVar21.m_i = ((pQVar22->crect).y2.m_i - uVar9) + 1;
  local_60.ht.m_i = RVar21.m_i;
  local_60.wd.m_i = RVar23.m_i;
  bVar10 = RVar21.m_i != h;
  bVar11 = RVar23.m_i != w;
  iVar17 = (int)uVar25;
  bVar12 = y != uVar9;
  bVar13 = iVar17 != uVar3;
  bVar24 = isMove || (bVar12 || bVar13);
  if (((w == RVar23.m_i) && (h == RVar21.m_i)) && (uVar9 == y && iVar17 == uVar3))
  goto LAB_00306ca7;
  iVar20 = w + iVar17 + -1;
  iVar26 = h + y + -1;
  if (((this->data).field_0x11 & 8) == 0) {
    pQVar22->field_0x10 = pQVar22->field_0x10 & 0xfd;
    puVar1 = &this_00->data->field_0x10;
    *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffffb;
    if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
      createTLExtra(this);
      _Var6.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
      super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
      super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
           (((this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
           super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
      *(undefined8 *)
       ((long)_Var6.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
              super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
              super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xa0) = 0;
      *(undefined8 *)
       ((long)_Var6.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
              super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
              super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xa8) = 0xfffffffefffffffe;
    }
  }
  QVar18 = QWidget::pos(this_00);
  uVar25 = uVar25 | (ulong)(uint)y << 0x20;
  (this->data).crect.x1 = (Representation)(int)uVar25;
  (this->data).crect.y1 = (Representation)(int)(uVar25 >> 0x20);
  (this->data).crect.x2.m_i = iVar20;
  (this->data).crect.y2.m_i = iVar26;
  pQVar22 = this_00->data;
  local_68 = QVar18;
  if ((((pQVar22->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
        super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) &&
     (((lVar5 = *(long *)(*(long *)&this_00->field_0x8 + 0x78), lVar5 == 0 ||
       (lVar5 = *(long *)(lVar5 + 8), lVar5 == 0)) || (*(long *)(lVar5 + 0x20) == 0)))) {
LAB_003068ed:
    bVar15 = false;
  }
  else {
    if ((((this->data).field_0x10 & 4) == 0) && ((w == 0 || (h == 0)))) {
      uVar2 = *(uint *)(*(long *)&this_00->field_0x8 + 0x240);
      if ((uVar2 >> 0x11 & 1) == 0) {
        *(uint *)(*(long *)&this_00->field_0x8 + 0x240) = uVar2 | 0x20000;
      }
      if ((pQVar22->widget_attributes & 0x8000) != 0) {
        hide_sys(this);
      }
      (this->data).crect.x1.m_i = iVar17;
      (this->data).crect.y1.m_i = y;
      (this->data).crect.x2.m_i = iVar20;
      (this->data).crect.y2.m_i = iVar26;
      pQVar22 = this_00->data;
      goto LAB_003068ed;
    }
    uVar2 = *(uint *)(*(long *)&this_00->field_0x8 + 0x240);
    if ((uVar2 >> 0x11 & 1) == 0) {
      bVar15 = false;
    }
    else {
      *(uint *)(*(long *)&this_00->field_0x8 + 0x240) = uVar2 & 0xfffdffff;
      bVar15 = true;
    }
  }
  if ((pQVar22->widget_attributes & 0x8000) == 0) {
    if ((isMove || (bVar12 || bVar13)) && (QVar19 = QWidget::pos(this_00), QVar18 != QVar19)) {
      uVar2 = *(uint *)(*(long *)&this_00->field_0x8 + 0x240);
      if ((uVar2 & 4) == 0) {
        *(uint *)(*(long *)&this_00->field_0x8 + 0x240) = uVar2 | 4;
      }
    }
    if (bVar10 || bVar11) {
      uVar2 = *(uint *)(*(long *)&this_00->field_0x8 + 0x240);
      if ((uVar2 & 8) == 0) {
        *(uint *)(*(long *)&this_00->field_0x8 + 0x240) = uVar2 | 8;
      }
    }
  }
  else {
    lVar5 = *(long *)&this_00->field_0x8;
    if (((*(byte *)(lVar5 + 0x248) & 0x80) == 0) && ((*(byte *)(lVar5 + 0x242) & 2) == 0)) {
      if ((*(long *)(lVar5 + 0x78) != 0) &&
         ((lVar5 = *(long *)(*(long *)(lVar5 + 0x78) + 8), lVar5 != 0 &&
          (pQVar7 = *(QRect **)(lVar5 + 0x20), pQVar7 != (QRect *)0x0)))) {
        if (((pQVar22->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
          parent = this_00;
          do {
            parent = *(QWidget **)(*(long *)&parent->field_0x8 + 0x10);
            if (parent == (QWidget *)0x0) break;
          } while (parent->data->winid == 0);
          local_58._0_4_ = 0;
          local_58._4_4_ = 0;
          local_58 = (undefined1  [8])QWidget::mapTo(this_00,parent,(QPoint *)local_58);
          uStack_50 = (undefined1 *)CONCAT44(h + -1 + local_58._4_4_,w + -1 + local_58._0_4_);
          QWindow::setGeometry(pQVar7);
        }
        else if ((bVar10 || bVar11) && (!isMove && (!bVar12 && !bVar13))) {
          QWindow::resize((int)pQVar7,w);
        }
        else if (bVar24 && (!bVar10 && !bVar11)) {
          QWindow::setPosition((int)pQVar7,iVar17);
        }
        else {
          QWindow::setGeometry(pQVar7);
        }
        if (bVar15) {
          show_sys(this);
        }
      }
      if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
        if ((this->field_0x253 & 1) == 0) {
          if (bVar24 && (!bVar10 && !bVar11)) {
            uStack_50 = (undefined1 *)
                        CONCAT44(local_60.ht.m_i.m_i + local_68.yp.m_i.m_i + -1,
                                 local_60.wd.m_i.m_i + local_68.xp.m_i.m_i + -1);
            local_58._0_4_ = local_68.xp.m_i;
            local_58._4_4_ = local_68.yp.m_i;
            moveRect(this,(QRect *)local_58,iVar17 - local_68.xp.m_i,y - local_68.yp.m_i);
          }
          else {
            invalidateBackingStore_resizeHelper(this,&local_68,&local_60);
          }
        }
        else {
          local_70 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
          QRegion::QRegion((QRegion *)&local_70,&this_00->data->crect,Rectangle);
          uStack_50 = (undefined1 *)
                      CONCAT44(local_60.ht.m_i.m_i + local_68.yp.m_i.m_i + -1,
                               local_60.wd.m_i.m_i + local_68.xp.m_i.m_i + -1);
          local_58._0_4_ = local_68.xp.m_i;
          local_58._4_4_ = local_68.yp.m_i;
          QRegion::operator+=((QRegion *)&local_70,(QRect *)local_58);
          invalidateBackingStore<QRegion>
                    (*(QWidgetPrivate **)(*(long *)(*(long *)&this_00->field_0x8 + 0x10) + 8),
                     (QRegion *)&local_70);
          QRegion::~QRegion((QRegion *)&local_70);
        }
      }
    }
    if (bVar24) {
      pQStack_48 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_70 = (QSize)QWidget::pos(this_00);
      QMoveEvent::QMoveEvent((QMoveEvent *)local_58,(QPoint *)&local_70,&local_68);
      QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)local_58);
      QMoveEvent::~QMoveEvent((QMoveEvent *)local_58);
    }
    if (bVar10 || bVar11) {
      local_70.ht.m_i = h;
      local_70.wd.m_i = w;
      pQStack_48 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      uStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      QResizeEvent::QResizeEvent((QResizeEvent *)local_58,&local_70,&local_60);
      QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)local_58);
      pQVar4 = ((*(QWidgetPrivate **)&this_00->field_0x8)->extra)._M_t.
               super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
               super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
               super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
      if (((pQVar4 != (QWExtra *)0x0) &&
          (tVar8.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
           super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
                *(_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_> *)
                 &(pQVar4->topextra)._M_t.
                  super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>,
          tVar8.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
          super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl !=
          (_Head_base<0UL,_QTLWExtra_*,_false>)0x0)) &&
         (*(long *)((long)tVar8.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>
                          .super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x20) != 0)) {
        pQVar22 = this_00->data;
        auVar14._4_4_ = (pQVar22->crect).y2.m_i - (pQVar22->crect).y1.m_i;
        auVar14._0_4_ = (pQVar22->crect).x2.m_i - (pQVar22->crect).x1.m_i;
        auVar14._8_8_ = 0;
        update<QRect>(*(QWidgetPrivate **)&this_00->field_0x8,(QRect)(auVar14 << 0x40));
      }
      QResizeEvent::~QResizeEvent((QResizeEvent *)local_58);
    }
  }
  cVar16 = QAccessible::isActive();
  if ((cVar16 != '\0') && ((this_00->data->widget_attributes & 0x8000) != 0)) {
    local_58 = (undefined1  [8])QFont::strikeOut;
    uStack_50 = (undefined1 *)0xaaaaaaaa0000800b;
    puStack_40 = (undefined1 *)0xaaaaaaaaffffffff;
    pQStack_48 = this_00;
    QAccessible::updateAccessibility((QAccessibleEvent *)local_58);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)local_58);
  }
LAB_00306ca7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::setGeometry_sys(int x, int y, int w, int h, bool isMove)
{
    Q_Q(QWidget);
    if (extra) {                                // any size restrictions?
        w = qMin(w,extra->maxw);
        h = qMin(h,extra->maxh);
        w = qMax(w,extra->minw);
        h = qMax(h,extra->minh);
    }

    if (q->isWindow() && q->windowHandle()) {
        QPlatformIntegration *integration = QGuiApplicationPrivate::platformIntegration();
        if (!integration->hasCapability(QPlatformIntegration::NonFullScreenWindows)) {
            x = 0;
            y = 0;
            w = q->windowHandle()->width();
            h = q->windowHandle()->height();
        }
    }

    QPoint oldp = q->geometry().topLeft();
    QSize olds = q->size();
    QRect r(x, y, w, h);

    bool isResize = olds != r.size();
    if (!isMove)
        isMove = oldp != r.topLeft();


    // We only care about stuff that changes the geometry, or may
    // cause the window manager to change its state
    if (r.size() == olds && oldp == r.topLeft())
        return;

    if (!data.in_set_window_state) {
        q->data->window_state &= ~Qt::WindowMaximized;
        q->data->window_state &= ~Qt::WindowFullScreen;
        if (q->isWindow())
            topData()->normalGeometry = QRect(0, 0, -1, -1);
    }

    QPoint oldPos = q->pos();
    data.crect = r;

    bool needsShow = false;

    if (q->isWindow() || q->windowHandle()) {
        if (!(data.window_state & Qt::WindowFullScreen) && (w == 0 || h == 0)) {
            q->setAttribute(Qt::WA_OutsideWSRange, true);
            if (q->isVisible())
                hide_sys();
            data.crect = QRect(x, y, w, h);
        } else if (q->testAttribute(Qt::WA_OutsideWSRange)) {
            q->setAttribute(Qt::WA_OutsideWSRange, false);
            needsShow = true;
        }
    }

    if (q->isVisible()) {
        if (!q->testAttribute(Qt::WA_DontShowOnScreen) && !q->testAttribute(Qt::WA_OutsideWSRange)) {
            if (QWindow *win = q->windowHandle()) {
                if (q->isWindow()) {
                    if (isResize && !isMove)
                        win->resize(w, h);
                    else if (isMove && !isResize)
                        win->setPosition(x, y);
                    else
                        win->setGeometry(q->geometry());
                } else {
                    QPoint posInNativeParent =  q->mapTo(q->nativeParentWidget(),QPoint());
                    win->setGeometry(QRect(posInNativeParent,r.size()));
                }

                if (needsShow)
                    show_sys();
            }

            if (!q->isWindow()) {
                if (renderToTexture) {
                    QRegion updateRegion(q->geometry());
                    updateRegion += QRect(oldPos, olds);
                    q->parentWidget()->d_func()->invalidateBackingStore(updateRegion);
                } else if (isMove && !isResize) {
                    moveRect(QRect(oldPos, olds), x - oldPos.x(), y - oldPos.y());
                } else {
                    invalidateBackingStore_resizeHelper(oldPos, olds);
                }
            }
        }

        if (isMove) {
            QMoveEvent e(q->pos(), oldPos);
            QCoreApplication::sendEvent(q, &e);
        }
        if (isResize) {
            QResizeEvent e(r.size(), olds);
            QCoreApplication::sendEvent(q, &e);
            if (q->windowHandle())
                q->update();
        }
    } else { // not visible
        if (isMove && q->pos() != oldPos)
            q->setAttribute(Qt::WA_PendingMoveEvent, true);
        if (isResize)
            q->setAttribute(Qt::WA_PendingResizeEvent, true);
    }

#if QT_CONFIG(accessibility)
    if (QAccessible::isActive() && q->isVisible()) {
        QAccessibleEvent event(q, QAccessible::LocationChanged);
        QAccessible::updateAccessibility(&event);
    }
#endif
}